

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  IStreamingReporter *pIVar1;
  int iVar2;
  IMutableContext *pIVar3;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_348;
  string local_328;
  Totals local_308;
  TestCaseInfo local_2d0;
  TestCaseStats local_1c0;
  
  local_308.assertions.passed = (this->m_totals).assertions.passed;
  local_308.assertions.failed = (this->m_totals).assertions.failed;
  local_308.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_308.testCases.passed = (this->m_totals).testCases.passed;
  local_308.testCases.failed = (this->m_totals).testCases.failed;
  local_308.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2d0,&testCase->super_TestCaseInfo);
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar1,&local_2d0);
  this->m_activeTestCase = testCase;
  SectionTracking::TestCaseTracker::TestCaseTracker((TestCaseTracker *)&local_1c0,&local_2d0.name);
  this_00 = &this->m_testCaseTracker;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)&local_1c0);
  SectionTracking::TrackedSection::~TrackedSection((TrackedSection *)&local_1c0);
LAB_0015f523:
  do {
    runCurrentTest(this,&local_328,&local_348);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])(this);
      if ((char)iVar2 == '\0') goto LAB_0015f523;
    }
    pIVar3 = getCurrentMutableContext();
    iVar2 = (*(pIVar3->super_IContext)._vptr_IContext[5])(pIVar3);
    if ((char)iVar2 == '\0') goto LAB_0015f566;
    iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])(this);
    if ((char)iVar2 != '\0') {
LAB_0015f566:
      Totals::delta(__return_storage_ptr__,&this->m_totals,&local_308);
      Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
      pIVar1 = (this->m_reporter).m_p;
      iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])(this);
      TestCaseStats::TestCaseStats
                (&local_1c0,&local_2d0,__return_storage_ptr__,&local_328,&local_348,SUB41(iVar2,0));
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar1,&local_1c0);
      TestCaseStats::~TestCaseStats(&local_1c0);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      TestCaseInfo::~TestCaseInfo(&local_2d0);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_328);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }